

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree(TaprootScriptTree *this,TaprootScriptTree *tap_tree)

{
  uint8_t leaf_version;
  bool bVar1;
  CfdException *this_00;
  allocator local_49;
  undefined1 local_48 [32];
  
  TapBranch::TapBranch(&this->super_TapBranch,&tap_tree->super_TapBranch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_005cc8c8;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  leaf_version = (tap_tree->super_TapBranch).leaf_version_;
  bVar1 = TaprootUtil::IsValidLeafVersion(leaf_version);
  if (bVar1) {
    (this->super_TapBranch).has_leaf_ = (tap_tree->super_TapBranch).has_leaf_;
    (this->super_TapBranch).leaf_version_ = leaf_version;
    Script::operator=(&(this->super_TapBranch).script_,&(tap_tree->super_TapBranch).script_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->super_TapBranch).root_commitment_.data_,
               &(tap_tree->super_TapBranch).root_commitment_.data_);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
              (&(this->super_TapBranch).branch_list_,&(tap_tree->super_TapBranch).branch_list_);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
              (&this->nodes_,&tap_tree->nodes_);
    return;
  }
  local_48._0_8_ = "cfdcore_taproot.cpp";
  local_48._8_4_ = 0x1ee;
  local_48._16_8_ = "TaprootScriptTree";
  logger::warn<unsigned_char_const&>
            ((CfdSourceLocation *)local_48,"Unsupported leaf version. [{}]",
             &(tap_tree->super_TapBranch).leaf_version_);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_48,"Unsupported leaf version.",&local_49);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

TaprootScriptTree::TaprootScriptTree(const TaprootScriptTree& tap_tree)
    : TapBranch(tap_tree) {
  if (!TaprootUtil::IsValidLeafVersion(tap_tree.leaf_version_)) {
    warn(
        CFD_LOG_SOURCE, "Unsupported leaf version. [{}]",
        tap_tree.leaf_version_);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
  has_leaf_ = tap_tree.has_leaf_;
  leaf_version_ = tap_tree.leaf_version_;
  script_ = tap_tree.script_;
  root_commitment_ = tap_tree.root_commitment_;
  branch_list_ = tap_tree.branch_list_;
  nodes_ = tap_tree.nodes_;
}